

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void __thiscall FPolyObj::UpdateBBox(FPolyObj *this)

{
  ulong uVar1;
  
  if ((this->Linedefs).Count != 0) {
    uVar1 = 0;
    do {
      P_AdjustLine((this->Linedefs).Array[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->Linedefs).Count);
  }
  CalcCenter(this);
  return;
}

Assistant:

void FPolyObj::UpdateBBox ()
{
	for(unsigned i=0;i<Linedefs.Size(); i++)
	{
		P_AdjustLine(Linedefs[i]);
	}
	CalcCenter();
}